

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator_mri.c
# Opt level: O2

int check_retval(void *returnvalue,char *funcname,int opt)

{
  if (returnvalue == (void *)0x0 && opt == 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed - returned NULL pointer\n\n",funcname);
  }
  else {
    if (opt != 1) {
      return 0;
    }
    if (-1 < *returnvalue) {
      return 0;
    }
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",funcname);
  }
  return 1;
}

Assistant:

static int check_retval(void* returnvalue, const char* funcname, int opt)
{
  int* retval;

  /* Check if SUNDIALS function returned NULL pointer - no memory allocated */
  if (opt == 0 && returnvalue == NULL)
  {
    fprintf(stderr, "\nSUNDIALS_ERROR: %s() failed - returned NULL pointer\n\n",
            funcname);
    return 1;
  }

  /* Check if retval < 0 */
  else if (opt == 1)
  {
    retval = (int*)returnvalue;
    if (*retval < 0)
    {
      fprintf(stderr, "\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
              funcname, *retval);
      return 1;
    }
  }

  /* Check if function returned NULL pointer - no memory allocated */
  else if (opt == 2 && returnvalue == NULL)
  {
    fprintf(stderr, "\nMEMORY_ERROR: %s() failed - returned NULL pointer\n\n",
            funcname);
    return 1;
  }

  return 0;
}